

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O2

bool __thiscall VPPOperator::Prepare(VPPOperator *this,RunContext *ctx)

{
  pointer pCVar1;
  size_type sVar2;
  Connection *c;
  Connection *pCVar3;
  CommandBlock *pCVar4;
  bool bVar5;
  Connection *this_00;
  long lVar6;
  ulong uVar7;
  Connection *c_1;
  pointer pCVar8;
  ulong uVar9;
  vector<Connection_*,_std::allocator<Connection_*>_> outputs;
  string fifoname;
  string from;
  string to;
  string command;
  string to2;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string fifo;
  
  std::__cxx11::string::string((string *)&command,(string *)&this->command);
  for (uVar7 = 0; (long)uVar7 < (long)this->ninputs; uVar7 = uVar7 + 1) {
    this_00 = (Connection *)0x0;
    for (pCVar3 = (this->super_BaseNode).connections.
                  super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar3 != (this->super_BaseNode).connections.
                  super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                  super__Vector_impl_data._M_finish; pCVar3 = pCVar3 + 1) {
      if (((VPPOperator *)pCVar3->input_node == this) &&
         (pCVar3->input_slot == PipeInputSlotNames[uVar7])) {
        this_00 = pCVar3;
      }
    }
    if (this_00 == (Connection *)0x0) {
      bVar5 = false;
      printf("input slot %d not connected?\n",uVar7 & 0xffffffff);
      goto LAB_0014a838;
    }
    Connection::GetFifoName_abi_cxx11_(&fifoname,this_00,ctx);
    sVar2 = fifoname._M_string_length;
    if (fifoname._M_string_length == 0) {
      printf("slot %d not prepared\n");
    }
    else {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&from,
                 PipeInputSlotNames[uVar7],0x10);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
                (&fifo,&command,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&from,
                 &fifoname,0);
      std::__cxx11::string::operator=((string *)&command,(string *)&fifo);
      std::__cxx11::string::~string((string *)&fifo);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&from);
    }
    std::__cxx11::string::~string((string *)&fifoname);
    if (sVar2 == 0) goto LAB_0014a7af;
  }
  for (lVar6 = 0; lVar6 < this->noutputs; lVar6 = lVar6 + 1) {
    outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pCVar1 = (this->super_BaseNode).connections.
             super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar8 = (this->super_BaseNode).connections.
                  super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar8 != pCVar1; pCVar8 = pCVar8 + 1) {
      if (((VPPOperator *)pCVar8->output_node == this) &&
         (pCVar8->output_slot == PipeOutputSlotNames[lVar6])) {
        fifoname._M_dataplus._M_p = (pointer)pCVar8;
        std::vector<Connection*,std::allocator<Connection*>>::emplace_back<Connection*>
                  ((vector<Connection*,std::allocator<Connection*>> *)&outputs,
                   (Connection **)&fifoname);
      }
    }
    if (outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar5 = false;
      printf("output slot %d not connected?\n");
      std::_Vector_base<Connection_*,_std::allocator<Connection_*>_>::~_Vector_base
                (&outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>);
      goto LAB_0014a838;
    }
    fifoname._M_dataplus._M_p = (pointer)&fifoname.field_2;
    fifoname._M_string_length = 0;
    fifoname.field_2._M_local_buf[0] = '\0';
    if ((long)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      Connection::GetFifoName_abi_cxx11_
                (&fifo,*outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,ctx);
      std::__cxx11::string::operator=((string *)&fifoname,(string *)&fifo);
      std::__cxx11::string::~string((string *)&fifo);
    }
    else {
      RunContext::MakeFifo_abi_cxx11_(&fifo,ctx);
      std::__cxx11::string::_M_assign((string *)&fifoname);
      for (uVar7 = 1; uVar9 = (ulong)((int)uVar7 - 1),
          uVar9 < ((long)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) - 1U;
          uVar7 = (ulong)((int)uVar7 + 1)) {
        std::__cxx11::string::string((string *)&from,(string *)&fifo);
        to._M_dataplus._M_p = (pointer)&to.field_2;
        to._M_string_length = 0;
        to.field_2._M_local_buf[0] = '\0';
        if (((long)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) - 2U == uVar9) {
          Connection::GetFifoName_abi_cxx11_
                    (&to2,outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar7],ctx);
          std::__cxx11::string::operator=((string *)&to,(string *)&to2);
          std::__cxx11::string::~string((string *)&to2);
        }
        else {
          RunContext::MakeFifo_abi_cxx11_(&to2,ctx);
          std::__cxx11::string::operator=((string *)&fifo,(string *)&to2);
          std::__cxx11::string::~string((string *)&to2);
          std::__cxx11::string::_M_assign((string *)&to);
        }
        Connection::GetFifoName_abi_cxx11_
                  (&to2,outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9],ctx);
        pCVar4 = (CommandBlock *)operator_new(0x50);
        std::operator+(&local_f0,"vp dup ",&from);
        std::operator+(&local_d0,&local_f0," ");
        std::operator+(&local_b0,&local_d0,&to);
        std::operator+(&local_90,&local_b0," ");
        std::operator+(&local_70,&local_90,&to2);
        CommandBlock::CommandBlock(pCVar4,&local_70);
        Pipeline::Add(&ctx->pipeline,(Block *)pCVar4);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&to2);
        std::__cxx11::string::~string((string *)&to);
        std::__cxx11::string::~string((string *)&from);
      }
      std::__cxx11::string::~string((string *)&fifo);
    }
    sVar2 = fifoname._M_string_length;
    if (fifoname._M_string_length == 0) {
      printf("slot %d not prepared\n");
    }
    else {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&from,
                 PipeOutputSlotNames[lVar6],0x10);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
                (&fifo,&command,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&from,
                 &fifoname,0);
      std::__cxx11::string::operator=((string *)&command,(string *)&fifo);
      std::__cxx11::string::~string((string *)&fifo);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&from);
    }
    std::__cxx11::string::~string((string *)&fifoname);
    std::_Vector_base<Connection_*,_std::allocator<Connection_*>_>::~_Vector_base
              (&outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>);
    if (sVar2 == 0) goto LAB_0014a7af;
  }
  pCVar4 = (CommandBlock *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_110,(string *)&command);
  CommandBlock::CommandBlock(pCVar4,&local_110);
  this->block = pCVar4;
  std::__cxx11::string::~string((string *)&local_110);
  bVar5 = true;
  Pipeline::Add(&ctx->pipeline,&this->block->super_Block);
LAB_0014a838:
  std::__cxx11::string::~string((string *)&command);
  return bVar5;
LAB_0014a7af:
  bVar5 = false;
  goto LAB_0014a838;
}

Assistant:

virtual bool Prepare(RunContext& ctx) override
    {
        std::string command = this->command;
        for (int i = 0; i < ninputs; i++) {
            Connection* con = nullptr;
            for (auto& c : connections)
            {
                if (c.input_node != this || c.input_slot != PipeInputSlotNames[i])
                    continue;
                con = &c;
            }
            if (!con) {
                printf("input slot %d not connected?\n", i);
                return false;
            }
            const std::string& name = con->GetFifoName(ctx);
            if (name.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeInputSlotNames[i]), name);
        }
        // TODO: duplicate output if multiple inputs use it
        for (int i = 0; i < noutputs; i++) {
            std::vector<Connection*> outputs;
            for (auto& c : connections)
            {
                if (c.output_node != this || c.output_slot != PipeOutputSlotNames[i])
                    continue;
                outputs.push_back(&c);
            }
            if (outputs.empty()) {
                printf("output slot %d not connected?\n", i);
                return false;
            }
            std::string fifoname;
            if (outputs.size() == 1)
            {
                fifoname = outputs[0]->GetFifoName(ctx);
            }
            else
            {
                // multiple outputs, so we need to duplicate the stream
                // XXX: this is vpp specific
                auto fifo = ctx.MakeFifo();
                fifoname = fifo;
                for (unsigned i = 0; i < outputs.size() - 1; i++)
                {
                    std::string from = fifo;
                    std::string to;
                    if (i == outputs.size() - 2)
                    {
                        to = outputs[i+1]->GetFifoName(ctx);
                    }
                    else
                    {
                        fifo = ctx.MakeFifo();
                        to = fifo;
                    }
                    std::string to2 = outputs[i]->GetFifoName(ctx);
                    ctx.CollectBlock(new CommandBlock("vp dup " + from + " " + to + " " + to2));
                }
            }
            if (fifoname.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeOutputSlotNames[i]), fifoname);
        }

        block = new CommandBlock(command);
        ctx.CollectBlock(block);
        return true;
    }